

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_firedemon.cpp
# Opt level: O0

int AF_A_FiredChase(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *this;
  DObject *this_00;
  short sVar1;
  uint uVar2;
  int iVar3;
  AActor *pAVar4;
  bool bVar5;
  double dVar6;
  bool local_96;
  bool local_93;
  Self local_90;
  TFlags<ActorFlag,_unsigned_int> local_8c;
  TAngle<double> local_88;
  undefined1 local_80 [12];
  TFlags<ActorFlag,_unsigned_int> local_74;
  DObject *local_70;
  double dist;
  DAngle ang;
  AActor *target;
  int weaveindex;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_firedemon.cpp"
                  ,0x88,"int AF_A_FiredChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar5 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar5 = true, (param->field_0).field_1.atag != 1)) {
    bVar5 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar5) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_firedemon.cpp"
                  ,0x88,"int AF_A_FiredChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  this = *(AActor **)&param->field_0;
  local_93 = true;
  if (this != (AActor *)0x0) {
    local_93 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
  }
  if (local_93 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_firedemon.cpp"
                  ,0x88,"int AF_A_FiredChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
    bVar5 = false;
    if ((param[1].field_0.field_3.Type == '\x03') &&
       (bVar5 = true, param[1].field_0.field_1.atag != 1)) {
      bVar5 = param[1].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar5) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_firedemon.cpp"
                    ,0x88,"int AF_A_FiredChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    this_00 = (DObject *)param[1].field_0.field_1.a;
    local_96 = true;
    if (this_00 != (DObject *)0x0) {
      local_96 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_96 == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_firedemon.cpp"
                    ,0x88,"int AF_A_FiredChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
    bVar5 = false;
    if ((param[2].field_0.field_3.Type == '\x03') &&
       (bVar5 = true, param[2].field_0.field_1.atag != 8)) {
      bVar5 = param[2].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar5) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_firedemon.cpp"
                    ,0x88,"int AF_A_FiredChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  iVar3 = this->special1;
  ang.Degrees = (double)TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
  TAngle<double>::TAngle((TAngle<double> *)&dist);
  if (this->reactiontime != 0) {
    this->reactiontime = this->reactiontime + -1;
  }
  if (this->threshold != 0) {
    this->threshold = this->threshold + -1;
  }
  dVar6 = BobSin((double)iVar3);
  AActor::AddZ(this,dVar6,true);
  this->special1 = iVar3 + 2U & 0x3f;
  dVar6 = AActor::Z(this);
  if (dVar6 < this->floorz + 64.0) {
    AActor::AddZ(this,2.0,true);
  }
  pAVar4 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
  bVar5 = true;
  if (pAVar4 != (AActor *)0x0) {
    pAVar4 = TObjPtr<AActor>::operator->(&this->target);
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_74,(int)pAVar4 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_74);
    bVar5 = uVar2 == 0;
  }
  if (bVar5) {
    P_LookForPlayers(this,1,(FLookExParams *)0x0);
  }
  else {
    if (this->special2 < 1) {
      this->special2 = 0;
      (this->Vel).Y = 0.0;
      (this->Vel).X = 0.0;
      local_70 = (DObject *)AActor::Distance2D(this,(AActor *)ang.Degrees,false);
      if (((double)local_70 < 512.0) &&
         (iVar3 = FRandom::operator()(&pr_firedemonchase), iVar3 < 0x1e)) {
        AActor::AngleTo((AActor *)local_80,this,SUB81(ang.Degrees,0));
        TAngle<double>::operator=((TAngle<double> *)&dist,(TAngle<double> *)local_80);
        iVar3 = FRandom::operator()(&pr_firedemonchase);
        if (iVar3 < 0x80) {
          TAngle<double>::operator+=((TAngle<double> *)&dist,90.0);
        }
        else {
          TAngle<double>::operator-=((TAngle<double> *)&dist,90.0);
        }
        TAngle<double>::TAngle(&local_88,(TAngle<double> *)&dist);
        AActor::Thrust(this,&local_88,8.0);
        this->special2 = 3;
      }
    }
    else {
      this->special2 = this->special2 + -1;
    }
    FaceMovementDirection(this);
    if ((this->special2 == 0) &&
       ((sVar1 = this->movecount + -1, this->movecount = sVar1, sVar1 < 0 ||
        (bVar5 = P_Move(this), !bVar5)))) {
      P_NewChaseDir(this);
    }
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_8c,(int)this + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_8c);
    if (uVar2 == 0) {
      bVar5 = P_CheckMissileRange(this);
      if ((bVar5) && (iVar3 = FRandom::operator()(&pr_firedemonchase), iVar3 < 0x14)) {
        AActor::SetState(this,this->MissileState,false);
        TFlags<ActorFlag,_unsigned_int>::operator|=(&this->flags,MF_JUSTATTACKED);
        return 0;
      }
    }
    else {
      operator~((EnumType)&local_90);
      TFlags<ActorFlag,_unsigned_int>::operator&=(&this->flags,&local_90);
    }
    iVar3 = FRandom::operator()(&pr_firedemonchase);
    if (iVar3 < 3) {
      AActor::PlayActiveSound(this);
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FiredChase)
{
	PARAM_ACTION_PROLOGUE;

	int weaveindex = self->special1;
	AActor *target = self->target;
	DAngle ang;
	double dist;

	if (self->reactiontime) self->reactiontime--;
	if (self->threshold) self->threshold--;

	// Float up and down
	self->AddZ(BobSin(weaveindex));
	self->special1 = (weaveindex + 2) & 63;

	// Ensure it stays above certain height
	if (self->Z() < self->floorz + 64)
	{
		self->AddZ(2);
	}

	if(!self->target || !(self->target->flags&MF_SHOOTABLE))
	{	// Invalid target
		P_LookForPlayers (self,true, NULL);
		return 0;
	}

	// Strafe
	if (self->special2 > 0)
	{
		self->special2--;
	}
	else
	{
		self->special2 = 0;
		self->Vel.X = self->Vel.Y = 0;
		dist = self->Distance2D(target);
		if (dist < FIREDEMON_ATTACK_RANGE)
		{
			if (pr_firedemonchase() < 30)
			{
				ang = self->AngleTo(target);
				if (pr_firedemonchase() < 128)
					ang += 90;
				else
					ang -= 90;
				self->Thrust(ang, 8);
				self->special2 = 3;		// strafe time
			}
		}
	}

	FaceMovementDirection (self);

	// Normal movement
	if (!self->special2)
	{
		if (--self->movecount<0 || !P_Move (self))
		{
			P_NewChaseDir (self);
		}
	}

	// Do missile attack
	if (!(self->flags & MF_JUSTATTACKED))
	{
		if (P_CheckMissileRange (self) && (pr_firedemonchase() < 20))
		{
			self->SetState (self->MissileState);
			self->flags |= MF_JUSTATTACKED;
			return 0;
		}
	}
	else
	{
		self->flags &= ~MF_JUSTATTACKED;
	}

	// make active sound
	if (pr_firedemonchase() < 3)
	{
		self->PlayActiveSound ();
	}
	return 0;
}